

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

void timestamp(void)

{
  tm *__tp;
  size_t sVar1;
  time_t local_20;
  time_t now;
  
  local_20 = time((time_t *)0x0);
  __tp = localtime(&local_20);
  strftime(timestamp::time_buffer,0x28,"%d %B %Y %I:%M:%S %p",__tp);
  sVar1 = strlen(timestamp::time_buffer);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,timestamp::time_buffer,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return;
}

Assistant:

void timestamp ( )

//****************************************************************************80
//
//  Purpose:
//
//    TIMESTAMP prints the current YMDHMS date as a time stamp.
//
//  Example:
//
//    May 31 2001 09:45:54 AM
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    24 September 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    None
//
{
# define TIME_SIZE 40

  static char time_buffer[TIME_SIZE];
  const struct tm *tm;
  time_t now;

  now = time ( NULL );
  tm = localtime ( &now );

  strftime( time_buffer, TIME_SIZE, "%d %B %Y %I:%M:%S %p", tm );

  std::cout << time_buffer << "\n";

  return;
# undef TIME_SIZE
}